

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tommyarray.c
# Opt level: O1

void tommy_array_init(tommy_array *array)

{
  long lVar1;
  void **ppvVar2;
  long lVar3;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  array->bucket_bit = 6;
  array->bucket_max = 0x40;
  ppvVar2 = (void **)lrtr_calloc(0x40,8);
  array->bucket[0] = ppvVar2;
  lVar3 = 1;
  do {
    array->bucket[lVar3] = ppvVar2;
    lVar3 = lVar3 + 1;
  } while (lVar3 != 6);
  array->count = 0;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void tommy_array_init(tommy_array* array)
{
	tommy_uint_t i;

	/* fixed initial size */
	array->bucket_bit = TOMMY_ARRAY_BIT;
	array->bucket_max = 1 << array->bucket_bit;
	array->bucket[0] = tommy_cast(void**, tommy_calloc(array->bucket_max, sizeof(void*)));
	for (i = 1; i < TOMMY_ARRAY_BIT; ++i)
		array->bucket[i] = array->bucket[0];

	array->count = 0;
}